

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::StructPackingPass::StructPackingPass
          (StructPackingPass *this,char *structToPack,PackingRules rules)

{
  size_t sVar1;
  char *__s;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__StructPackingPass_009316d8;
  __s = "";
  if (structToPack != (char *)0x0) {
    __s = structToPack;
  }
  (this->structToPack_)._M_dataplus._M_p = (pointer)&(this->structToPack_).field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->structToPack_,__s,__s + sVar1);
  this->packingRules_ = rules;
  (this->constantsMap_)._M_h._M_buckets = &(this->constantsMap_)._M_h._M_single_bucket;
  (this->constantsMap_)._M_h._M_bucket_count = 1;
  (this->constantsMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->constantsMap_)._M_h._M_element_count = 0;
  (this->constantsMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->constantsMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->constantsMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

StructPackingPass::StructPackingPass(const char* structToPack,
                                     PackingRules rules)
    : structToPack_{structToPack != nullptr ? structToPack : ""},
      packingRules_{rules} {}